

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

bitset_container_t * bitset_container_clone(bitset_container_t *src)

{
  bitset_container_t *__ptr;
  uint64_t *__dest;
  size_t in_RSI;
  size_t alignment;
  
  alignment = 0x10;
  __ptr = (bitset_container_t *)malloc(0x10);
  if (__ptr != (bitset_container_t *)0x0) {
    __dest = (uint64_t *)roaring_bitmap_aligned_malloc(alignment,in_RSI);
    __ptr->words = __dest;
    if (__dest != (uint64_t *)0x0) {
      __ptr->cardinality = src->cardinality;
      memcpy(__dest,src->words,0x2000);
      return __ptr;
    }
    free(__ptr);
  }
  return (bitset_container_t *)0x0;
}

Assistant:

bitset_container_t *bitset_container_clone(const bitset_container_t *src) {
    bitset_container_t *bitset =
        (bitset_container_t *)malloc(sizeof(bitset_container_t));

    if (!bitset) {
        return NULL;
    }
    // sizeof(__m256i) == 32
    bitset->words = (uint64_t *)roaring_bitmap_aligned_malloc(
        32, sizeof(uint64_t) * BITSET_CONTAINER_SIZE_IN_WORDS);
    if (!bitset->words) {
        free(bitset);
        return NULL;
    }
    bitset->cardinality = src->cardinality;
    memcpy(bitset->words, src->words,
           sizeof(uint64_t) * BITSET_CONTAINER_SIZE_IN_WORDS);
    return bitset;
}